

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall
vkt::sr::ShaderRenderCaseInstance::uploadImage
          (ShaderRenderCaseInstance *this,TextureFormat *texFormat,TextureData *textureData,
          Sampler *refSampler,deUint32 mipLevels,deUint32 arrayLayers,VkImage destImage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Allocator *pAVar4;
  void *pvVar5;
  long lVar6;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  deUint32 dVar7;
  deUint32 dVar8;
  int iVar9;
  VkResult VVar10;
  VkDevice device;
  DeviceInterface *vk;
  VkQueue pVVar11;
  ulong size;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  pointer pvVar15;
  TextureFormat *format;
  ConstPixelBufferAccess *access;
  pointer this_00;
  long lVar16;
  undefined8 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> bufferAlloc;
  Move<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_258;
  undefined8 local_238;
  deUint64 local_230;
  uint local_228;
  undefined4 local_224;
  deUint32 local_220;
  undefined4 local_21c;
  deUint32 local_218;
  VkBufferCreateInfo bufferParams;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  VkSubmitInfo submitInfo;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> copyRegions;
  Move<vk::Handle<(vk::HandleType)6>_> fence;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsetMultiples;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  undefined4 local_b0 [2];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  deUint64 local_90;
  undefined8 local_88;
  ulong local_80;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  PixelBufferAccess destAccess;
  
  device = getDevice(this);
  vk = getDeviceInterface(this);
  pVVar11 = getUniversalQueue(this);
  dVar7 = getUniversalQueueFamilyIndex(this);
  uVar12 = 2 - (refSampler->compare == COMPAREMODE_NONE);
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object = (VkCommandBuffer_s *)0x0;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device = (VkDevice)0x0;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  copyRegions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  copyRegions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  copyRegions.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bufferParams.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&offsetMultiples,&bufferParams.sType);
  bufferParams.sType = tcu::TextureFormat::getPixelSize(texFormat);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&offsetMultiples,&bufferParams.sType);
  dVar8 = 0;
  for (pvVar15 = (textureData->
                 super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pvVar15 !=
      (textureData->
      super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish; pvVar15 = pvVar15 + 1) {
    for (this_00 = (pvVar15->
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        this_00 !=
        (pvVar15->
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        )._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      dVar8 = sr::anon_unknown_0::getNextMultiple(&offsetMultiples,dVar8);
      iVar1 = (this_00->m_size).m_data[0];
      iVar2 = (this_00->m_size).m_data[1];
      iVar3 = (this_00->m_size).m_data[2];
      iVar9 = tcu::TextureFormat::getPixelSize(&this_00->m_format);
      dVar8 = iVar3 * iVar9 * iVar2 * iVar1 + dVar8;
    }
  }
  bufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferParams.pNext = (void *)0x0;
  bufferParams._16_8_ = bufferParams._16_8_ & 0xffffffff00000000;
  size = (ulong)dVar8;
  bufferParams.usage = 1;
  bufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferParams._40_8_ = bufferParams._40_8_ & 0xffffffff00000000;
  bufferParams.pQueueFamilyIndices = (deUint32 *)0x0;
  bufferParams.size = size;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&submitInfo,vk,device,&bufferParams,
                     (VkAllocationCallbacks *)0x0);
  local_258.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(submitInfo.pWaitSemaphores._4_4_,submitInfo.pWaitSemaphores._0_4_);
  local_258.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_258.m_data.object.m_internal = submitInfo._0_8_;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       local_258.m_data.deleter.m_device;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       local_258.m_data.deleter.m_allocator;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       local_258.m_data.object.m_internal;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       local_258.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&submitInfo);
  pAVar4 = this->m_memAlloc;
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&local_258,vk,device,
             (VkBuffer)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
            );
  (*pAVar4->_vptr_Allocator[3])(&submitInfo,pAVar4,&local_258,1);
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  data._8_4_ = in_stack_fffffffffffffd10;
  data.ptr = (Allocation *)in_stack_fffffffffffffd08;
  data._12_4_ = in_stack_fffffffffffffd14;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data
            );
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&submitInfo);
  VVar10 = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,
                      buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                      ((bufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                       .ptr)->m_memory).m_internal,
                      (bufferAlloc.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_offset);
  ::vk::checkResult(VVar10,
                    "vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x440);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_258,vk,device,1,dVar7,
             (VkAllocationCallbacks *)0x0);
  bufferParams._16_8_ = local_258.m_data.deleter.m_device;
  bufferParams.size = (VkDeviceSize)local_258.m_data.deleter.m_allocator;
  bufferParams._0_8_ = local_258.m_data.object.m_internal;
  bufferParams.pNext = local_258.m_data.deleter.m_deviceIface;
  local_258.m_data.object.m_internal = 0;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_258.m_data.deleter.m_device = (VkDevice)0x0;
  local_258.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
            (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)bufferParams._16_8_;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)bufferParams.size;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       bufferParams._0_8_;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_258);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_258,vk,device,
             (VkCommandPool)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  bufferParams._16_8_ = local_258.m_data.deleter.m_device;
  bufferParams.size = (VkDeviceSize)local_258.m_data.deleter.m_allocator;
  bufferParams._0_8_ = local_258.m_data.object.m_internal;
  bufferParams.pNext = local_258.m_data.deleter.m_deviceIface;
  local_258.m_data.object.m_internal = 0;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_258.m_data.deleter.m_device = (VkDevice)0x0;
  local_258.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset
            (&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>);
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)bufferParams._16_8_;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       bufferParams.size;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)bufferParams._0_8_;
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferParams.pNext;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_258);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_258,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  bufferParams._16_8_ = local_258.m_data.deleter.m_device;
  bufferParams.size = (VkDeviceSize)local_258.m_data.deleter.m_allocator;
  bufferParams._0_8_ = local_258.m_data.object.m_internal;
  bufferParams.pNext = local_258.m_data.deleter.m_deviceIface;
  local_258.m_data.object.m_internal = 0;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_258.m_data.deleter.m_device = (VkDevice)0x0;
  local_258.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::reset
            (&fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)bufferParams._16_8_;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)bufferParams.size;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = bufferParams._0_8_;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&local_258);
  local_b0[0] = 0x2c;
  local_a8 = 0;
  local_a0 = 0x80000004000;
  uStack_98 = 0xffffffffffffffff;
  local_90 = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_88 = 0;
  bufferParams.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferParams.pNext = (void *)0x0;
  bufferParams.flags = 0;
  bufferParams._20_4_ = 0x1000;
  bufferParams.size = 0x700000000;
  bufferParams.usage = 0xffffffff;
  bufferParams.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  bufferParams._40_8_ = destImage.m_internal;
  bufferParams.pQueueFamilyIndices = (deUint32 *)(ulong)uVar12;
  local_258.m_data.object.m_internal._0_4_ = 0x2d;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_258.m_data.deleter.m_device = (VkDevice)0x2000001000;
  local_258.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x500000007;
  local_238 = 0xffffffffffffffff;
  local_230 = destImage.m_internal;
  local_224 = 0;
  local_21c = 0;
  cmdBufferBeginInfo.flags = 1;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext = (void *)0x0;
  pvVar5 = (bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
           .ptr)->m_hostPtr;
  uVar14 = 0;
  dVar7 = 0;
  local_228 = uVar12;
  local_220 = mipLevels;
  local_218 = arrayLayers;
  local_80 = size;
  while( true ) {
    pvVar15 = (textureData->
              super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(textureData->
                       super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15) / 0x18) <=
        uVar14) break;
    pvVar15 = pvVar15 + uVar14;
    lVar16 = 8;
    uVar13 = 0;
    while( true ) {
      lVar6 = *(long *)&(pvVar15->
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        )._M_impl.super__Vector_impl_data;
      if ((ulong)(((long)(pvVar15->
                         super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         )._M_impl.super__Vector_impl_data._M_finish - lVar6) / 0x28) <= uVar13)
      break;
      dVar7 = sr::anon_unknown_0::getNextMultiple(&offsetMultiples,dVar7);
      format = (TextureFormat *)(lVar6 + lVar16 + -8);
      tcu::PixelBufferAccess::PixelBufferAccess
                (&destAccess,format,(IVec3 *)(lVar6 + lVar16),(void *)((long)pvVar5 + (ulong)dVar7))
      ;
      submitInfo.pNext =
           (void *)CONCAT44(*(undefined4 *)(lVar6 + 4 + lVar16),*(undefined4 *)(lVar6 + lVar16));
      submitInfo._20_4_ = (int)uVar14;
      submitInfo.waitSemaphoreCount = uVar12;
      submitInfo.pWaitSemaphores._0_4_ = (undefined4)uVar13;
      submitInfo.pWaitSemaphores._4_4_ = 1;
      submitInfo.pWaitDstStageMask._0_4_ = 0;
      submitInfo.pWaitDstStageMask._4_4_ = 0;
      submitInfo.commandBufferCount = 0;
      submitInfo._44_4_ = *(undefined4 *)(lVar6 + lVar16);
      submitInfo.pCommandBuffers =
           (VkCommandBuffer *)
           CONCAT44(*(undefined4 *)(lVar6 + 8 + lVar16),*(undefined4 *)(lVar6 + 4 + lVar16));
      submitInfo._0_8_ = (ulong)dVar7;
      std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::push_back
                (&copyRegions,(value_type *)&submitInfo);
      tcu::copy((EVP_PKEY_CTX *)&destAccess,(EVP_PKEY_CTX *)format);
      iVar1 = *(int *)(lVar6 + lVar16);
      iVar2 = *(int *)(lVar6 + 4 + lVar16);
      iVar3 = *(int *)(lVar6 + 8 + lVar16);
      iVar9 = tcu::TextureFormat::getPixelSize(format);
      dVar7 = iVar3 * iVar9 * iVar2 * iVar1 + dVar7;
      uVar13 = uVar13 + 1;
      lVar16 = lVar16 + 0x28;
    }
    uVar14 = uVar14 + 1;
  }
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
               m_data.ptr)->m_memory).m_internal,
             (bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.ptr)->m_offset,size);
  VVar10 = (*vk->_vptr_DeviceInterface[0x49])
                     (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                      &cmdBufferBeginInfo);
  ::vk::checkResult(VVar10,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4b6);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x4000,0x1000,0,0,0,1
             ,local_b0,1,&bufferParams);
  (*vk->_vptr_DeviceInterface[0x62])
            (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             destImage.m_internal,7,
             ((long)copyRegions.
                    super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)copyRegions.
                   super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,
             copyRegions.
             super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x1000,1,0,0,0,0,0,1,
             &local_258);
  VVar10 = (*vk->_vptr_DeviceInterface[0x4a])
                     (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar10,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4ba);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask._0_4_ = 0;
  submitInfo.pWaitDstStageMask._4_4_ = 0;
  submitInfo._44_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&cmdBuffer;
  VVar10 = (*vk->_vptr_DeviceInterface[2])
                     (vk,pVVar11,1,&submitInfo,
                      fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal);
  ::vk::checkResult(VVar10,"vk.queueSubmit(queue, 1, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4c9);
  VVar10 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar10,"vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x4ca);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::~_Vector_base
            (&copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            (&fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            (&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  return;
}

Assistant:

void ShaderRenderCaseInstance::uploadImage (const tcu::TextureFormat&			texFormat,
											const TextureData&					textureData,
											const tcu::Sampler&					refSampler,
											deUint32							mipLevels,
											deUint32							arrayLayers,
											VkImage								destImage)
{
	const VkDevice					vkDevice				= getDevice();
	const DeviceInterface&			vk						= getDeviceInterface();
	const VkQueue					queue					= getUniversalQueue();
	const deUint32					queueFamilyIndex		= getUniversalQueueFamilyIndex();

	const bool						isShadowSampler			= refSampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	const VkImageAspectFlags		aspectMask				= isShadowSampler ? VK_IMAGE_ASPECT_DEPTH_BIT : VK_IMAGE_ASPECT_COLOR_BIT;
	deUint32						bufferSize				= 0u;
	Move<VkBuffer>					buffer;
	de::MovePtr<Allocation>			bufferAlloc;
	Move<VkCommandPool>				cmdPool;
	Move<VkCommandBuffer>			cmdBuffer;
	Move<VkFence>					fence;
	std::vector<VkBufferImageCopy>	copyRegions;
	std::vector<deUint32>			offsetMultiples;

	offsetMultiples.push_back(4u);
	offsetMultiples.push_back(texFormat.getPixelSize());

	// Calculate buffer size
	for (TextureData::const_iterator mit = textureData.begin(); mit != textureData.end(); ++mit)
	{
		for (TextureLayerData::const_iterator lit = mit->begin(); lit != mit->end(); ++lit)
		{
			const tcu::ConstPixelBufferAccess&	access	= *lit;

			bufferSize = getNextMultiple(offsetMultiples, bufferSize);
			bufferSize += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
		}
	}

	// Create source buffer
	{
		const VkBufferCreateInfo bufferParams =
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			bufferSize,									// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_SRC_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			0u,											// deUint32				queueFamilyIndexCount;
			DE_NULL,									// const deUint32*		pQueueFamilyIndices;
		};

		buffer		= createBuffer(vk, vkDevice, &bufferParams);
		bufferAlloc = m_memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));
	}

	// Create command pool and buffer
	cmdPool = createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, queueFamilyIndex);
	cmdBuffer = allocateCommandBuffer(vk, vkDevice, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create fence
	fence = createFence(vk, vkDevice);

	// Barriers for copying buffer to image
	const VkBufferMemoryBarrier preBufferBarrier =
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_HOST_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			dstQueueFamilyIndex;
		*buffer,									// VkBuffer			buffer;
		0u,											// VkDeviceSize		offset;
		bufferSize									// VkDeviceSize		size;
	};

	const VkImageMemoryBarrier preImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		destImage,										// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkImageMemoryBarrier postImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
		VK_ACCESS_SHADER_READ_BIT,						// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,		// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		destImage,										// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	// Get copy regions and write buffer data
	{
		deUint32	layerDataOffset		= 0;
		deUint8*	destPtr				= (deUint8*)bufferAlloc->getHostPtr();

		for (size_t levelNdx = 0; levelNdx < textureData.size(); levelNdx++)
		{
			const TextureLayerData&		layerData	= textureData[levelNdx];

			for (size_t layerNdx = 0; layerNdx < layerData.size(); layerNdx++)
			{
				layerDataOffset = getNextMultiple(offsetMultiples, layerDataOffset);

				const tcu::ConstPixelBufferAccess&	access		= layerData[layerNdx];
				const tcu::PixelBufferAccess		destAccess	(access.getFormat(), access.getSize(), destPtr + layerDataOffset);

				const VkBufferImageCopy				layerRegion =
				{
					layerDataOffset,						// VkDeviceSize				bufferOffset;
					(deUint32)access.getWidth(),			// deUint32					bufferRowLength;
					(deUint32)access.getHeight(),			// deUint32					bufferImageHeight;
					{										// VkImageSubresourceLayers	imageSubresource;
						aspectMask,								// VkImageAspectFlags		aspectMask;
						(deUint32)levelNdx,						// uint32_t					mipLevel;
						(deUint32)layerNdx,						// uint32_t					baseArrayLayer;
						1u										// uint32_t					layerCount;
					},
					{ 0u, 0u, 0u },							// VkOffset3D			imageOffset;
					{										// VkExtent3D			imageExtent;
						(deUint32)access.getWidth(),
						(deUint32)access.getHeight(),
						(deUint32)access.getDepth()
					}
				};

				copyRegions.push_back(layerRegion);
				tcu::copy(destAccess, access);

				layerDataOffset += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
			}
		}
	}

	flushMappedMemoryRange(vk, vkDevice, bufferAlloc->getMemory(), bufferAlloc->getOffset(), bufferSize);

	// Copy buffer to image
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &preBufferBarrier, 1, &preImageBarrier);
	vk.cmdCopyBufferToImage(*cmdBuffer, *buffer, destImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, (deUint32)copyRegions.size(), copyRegions.data());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
		DE_NULL,						// const void*					pNext;
		0u,								// deUint32						waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
		DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
		1u,								// deUint32						commandBufferCount;
		&cmdBuffer.get(),				// const VkCommandBuffer*		pCommandBuffers;
		0u,								// deUint32						signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*			pSignalSemaphores;
	};

	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) /* infinity */));
}